

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexedByLookup(Parse *pParse,SrcItem *pFrom)

{
  char *zRight;
  int iVar1;
  long in_RSI;
  Parse *in_RDI;
  bool bVar2;
  Index *pIdx;
  char *zIndexedBy;
  Table *pTab;
  undefined8 *local_30;
  uint local_4;
  
  zRight = *(char **)(in_RSI + 0x28);
  local_30 = *(undefined8 **)(*(long *)(in_RSI + 0x10) + 0x10);
  while( true ) {
    bVar2 = false;
    if (local_30 != (undefined8 *)0x0) {
      iVar1 = sqlite3StrICmp((char *)*local_30,zRight);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_30 = (undefined8 *)local_30[5];
  }
  if (local_30 != (undefined8 *)0x0) {
    *(undefined8 **)(in_RSI + 0x30) = local_30;
  }
  else {
    sqlite3ErrorMsg(in_RDI,"no such index: %s",zRight,0);
    in_RDI->checkSchema = '\x01';
  }
  local_4 = (uint)(local_30 == (undefined8 *)0x0);
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, SrcItem *pFrom){
  Table *pTab = pFrom->pSTab;
  char *zIndexedBy = pFrom->u1.zIndexedBy;
  Index *pIdx;
  assert( pTab!=0 );
  assert( pFrom->fg.isIndexedBy!=0 );

  for(pIdx=pTab->pIndex;
      pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy);
      pIdx=pIdx->pNext
  );
  if( !pIdx ){
    sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
    pParse->checkSchema = 1;
    return SQLITE_ERROR;
  }
  assert( pFrom->fg.isCte==0 );
  pFrom->u2.pIBIndex = pIdx;
  return SQLITE_OK;
}